

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O0

int Pdr_ManCheckContainment(Pdr_Man_t *p,int k,Pdr_Set_t *pSet)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p_00;
  Pdr_Set_t *pNew;
  int local_40;
  int kMax;
  int j;
  int i;
  Vec_Ptr_t *vArrayK;
  Pdr_Set_t *pThis;
  Pdr_Set_t *pSet_local;
  int k_local;
  Pdr_Man_t *p_local;
  
  iVar1 = Vec_PtrSize(p->vSolvers);
  kMax = k;
  do {
    if (iVar1 <= kMax) {
      return 0;
    }
    p_00 = Vec_VecEntry(p->vClauses,kMax);
    for (local_40 = 0; iVar2 = Vec_PtrSize(p_00), local_40 < iVar2; local_40 = local_40 + 1) {
      pNew = (Pdr_Set_t *)Vec_PtrEntry(p_00,local_40);
      iVar2 = Pdr_SetContains(pSet,pNew);
      if (iVar2 != 0) {
        return 1;
      }
    }
    kMax = kMax + 1;
  } while( true );
}

Assistant:

int Pdr_ManCheckContainment( Pdr_Man_t * p, int k, Pdr_Set_t * pSet )
{
    Pdr_Set_t * pThis;
    Vec_Ptr_t * vArrayK;
    int i, j, kMax = Vec_PtrSize(p->vSolvers)-1;
    Vec_VecForEachLevelStartStop( p->vClauses, vArrayK, i, k, kMax+1 )
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pThis, j )
            if ( Pdr_SetContains( pSet, pThis ) )
                return 1;
    return 0;
}